

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O0

span<char> __thiscall
libtorrent::aux::crypto_receive_buffer::mutable_buffer(crypto_receive_buffer *this,int bytes)

{
  span<char> sVar1;
  int local_34;
  int pending_decryption;
  int bytes_local;
  crypto_receive_buffer *this_local;
  
  local_34 = bytes;
  if (this->m_recv_pos != 0x7fffffff) {
    local_34 = receive_buffer::packet_size(this->m_connection_buffer);
    local_34 = local_34 - this->m_recv_pos;
  }
  sVar1 = receive_buffer::mutable_buffer(this->m_connection_buffer,local_34);
  return sVar1;
}

Assistant:

span<char> crypto_receive_buffer::mutable_buffer(
	int const bytes)
{
	int const pending_decryption = (m_recv_pos != INT_MAX)
		? m_connection_buffer.packet_size() - m_recv_pos
		: bytes;
	return m_connection_buffer.mutable_buffer(pending_decryption);
}